

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# aems.cpp
# Opt level: O3

ValuedAction __thiscall despot::AEMS::Search(AEMS *this)

{
  History *history;
  int *piVar1;
  BeliefLowerBound *pBVar2;
  BeliefUpperBound *pBVar3;
  pointer piVar4;
  pointer piVar5;
  bool bVar6;
  int iVar7;
  int iVar8;
  VNode *pVVar9;
  undefined4 extraout_var;
  Belief *pBVar10;
  clock_t cVar11;
  clock_t cVar12;
  clock_t cVar13;
  log_ostream *os;
  ostream *poVar14;
  long lVar15;
  size_type __new_size;
  SearchStatistics *pSVar16;
  SearchStatistics *pSVar17;
  byte bVar18;
  double value;
  double value_00;
  double dVar19;
  ValuedAction VVar20;
  double bestAE;
  VNode *local_b0;
  SearchStatistics *local_a8;
  double local_a0;
  double local_98;
  SearchStatistics local_90;
  
  bVar18 = 0;
  if (this->root_ == (VNode *)0x0) {
    pVVar9 = (VNode *)operator_new(0x98);
    iVar7 = (*((this->super_Solver).belief_)->_vptr_Belief[5])();
    VNode::VNode(pVVar9,(Belief *)CONCAT44(extraout_var,iVar7),0,(QNode *)0x0,0xffffffffffffffff);
    this->root_ = pVVar9;
    pBVar2 = this->lower_bound_;
    pBVar10 = VNode::belief(pVVar9);
    (*pBVar2->_vptr_BeliefLowerBound[3])(pBVar2,pBVar10);
    VNode::lower_bound(pVVar9,value);
    pVVar9 = this->root_;
    pBVar3 = this->upper_bound_;
    pBVar10 = VNode::belief(pVVar9);
    (*pBVar3->_vptr_BeliefUpperBound[2])(pBVar3,pBVar10);
    VNode::upper_bound(pVVar9,value_00);
  }
  SearchStatistics::SearchStatistics(&local_90);
  local_a8 = &this->statistics_;
  pSVar16 = &local_90;
  pSVar17 = local_a8;
  for (lVar15 = 0xc; lVar15 != 0; lVar15 = lVar15 + -1) {
    pSVar17->initial_lb = pSVar16->initial_lb;
    pSVar16 = (SearchStatistics *)((long)pSVar16 + (ulong)bVar18 * -0x10 + 8);
    pSVar17 = (SearchStatistics *)((long)pSVar17 + (ulong)bVar18 * -0x10 + 8);
  }
  iVar7 = (*(this->model_->super_DSPOMDP)._vptr_DSPOMDP[0x18])();
  (this->statistics_).num_particles_before_search = iVar7;
  (*(this->model_->super_DSPOMDP)._vptr_DSPOMDP[0x14])
            (this->model_,(this->super_Solver).belief_,&std::cout);
  cVar11 = clock();
  dVar19 = VNode::lower_bound(this->root_);
  (this->statistics_).initial_lb = dVar19;
  dVar19 = VNode::upper_bound(this->root_);
  (this->statistics_).initial_ub = dVar19;
  iVar7 = (*(this->model_->super_DSPOMDP)._vptr_DSPOMDP[0x18])();
  local_a0 = -INFINITY;
  history = &(this->super_Solver).history_;
  do {
    local_90.initial_lb = local_a0;
    local_b0 = (VNode *)0x0;
    FindMaxApproxErrorLeaf(this->root_,1.0,&local_90.initial_lb,&local_b0);
    pVVar9 = local_b0;
    bVar6 = VNode::IsLeaf(local_b0);
    if (!bVar6) {
      __assert_fail("promising_node->IsLeaf()",
                    "/workspace/llm4binary/github/license_c_cmakelists/AdaCompNUS[P]despot/src/solver/aems.cpp"
                    ,0x24,"virtual ValuedAction despot::AEMS::Search()");
    }
    piVar4 = (this->super_Solver).history_.actions_.super__Vector_base<int,_std::allocator<int>_>.
             _M_impl.super__Vector_impl_data._M_finish;
    piVar5 = (this->super_Solver).history_.actions_.super__Vector_base<int,_std::allocator<int>_>.
             _M_impl.super__Vector_impl_data._M_start;
    cVar12 = clock();
    Expand(pVVar9,this->lower_bound_,this->upper_bound_,this->model_,history);
    cVar13 = clock();
    (this->statistics_).time_node_expansion =
         (double)((cVar13 - cVar12) / 1000000) + (this->statistics_).time_node_expansion;
    Backup(pVVar9);
    __new_size = (size_type)(int)((ulong)((long)piVar4 - (long)piVar5) >> 2);
    std::vector<int,_std::allocator<int>_>::resize(&history->actions_,__new_size);
    std::vector<unsigned_long,_std::allocator<unsigned_long>_>::resize
              (&(this->super_Solver).history_.observations_,__new_size);
    iVar8 = VNode::depth(pVVar9);
    if ((this->statistics_).longest_trial_length < iVar8) {
      iVar8 = VNode::depth(pVVar9);
      (this->statistics_).longest_trial_length = iVar8;
    }
    piVar1 = &(this->statistics_).num_trials;
    *piVar1 = *piVar1 + 1;
    piVar1 = &(this->statistics_).num_expanded_nodes;
    *piVar1 = *piVar1 + 1;
    cVar12 = clock();
    if (Globals::config <= (double)(cVar12 - cVar11) / 1000000.0) break;
    local_98 = VNode::upper_bound(this->root_);
    dVar19 = VNode::lower_bound(this->root_);
  } while (1e-06 < local_98 - dVar19);
  iVar8 = (*(this->model_->super_DSPOMDP)._vptr_DSPOMDP[0x18])();
  (this->statistics_).num_tree_particles = iVar8 - iVar7;
  iVar7 = VNode::Size(this->root_);
  (this->statistics_).num_tree_nodes = iVar7;
  iVar7 = VNode::PolicyTreeSize(this->root_);
  (this->statistics_).num_policy_nodes = iVar7;
  iVar7 = (*(this->model_->super_DSPOMDP)._vptr_DSPOMDP[0x18])();
  (this->statistics_).num_particles_after_search = iVar7;
  dVar19 = VNode::lower_bound(this->root_);
  (this->statistics_).final_lb = dVar19;
  dVar19 = VNode::upper_bound(this->root_);
  (this->statistics_).final_ub = dVar19;
  cVar12 = clock();
  (this->statistics_).time_search = (double)(cVar12 - cVar11) / 1000000.0;
  iVar7 = logging::level();
  if (0 < iVar7) {
    iVar7 = logging::level();
    if (2 < iVar7) {
      os = logging::stream(3);
      std::__ostream_insert<char,std::char_traits<char>>(&os->super_ostream,"[AEMS::Search]",0xe);
      poVar14 = despot::operator<<(&os->super_ostream,local_a8);
      std::ios::widen((char)poVar14->_vptr_basic_ostream[-3] + (char)poVar14);
      std::ostream::put((char)poVar14);
      std::ostream::flush();
    }
  }
  VVar20 = OptimalAction(this->root_);
  return VVar20;
}

Assistant:

ValuedAction AEMS::Search() {
	if (root_ == NULL) {
		root_ = new VNode(belief_->MakeCopy());
		InitLowerBound(root_, lower_bound_, history_);
		InitUpperBound(root_, upper_bound_, history_);
	}

	statistics_ = SearchStatistics();
	statistics_.num_particles_before_search = model_->NumActiveParticles();

	model_->PrintBelief(*belief_); //TODO: check and remove
	// cout << *belief_ << endl;
	clock_t begin = clock();
	statistics_.initial_lb = root_->lower_bound();
	statistics_.initial_ub = root_->upper_bound();

	int num_active_particles = model_->NumActiveParticles();
	do {
		VNode* promising_node = FindMaxApproxErrorLeaf(root_);
		assert(promising_node->IsLeaf());

		int hist_size = history_.Size();
		clock_t start = clock();
		Expand(promising_node, lower_bound_, upper_bound_, model_, history_);
		statistics_.time_node_expansion += (clock() - start) / CLOCKS_PER_SEC;
		Backup(promising_node);
		history_.Truncate(hist_size);

		if (promising_node->depth() > statistics_.longest_trial_length) {
			statistics_.longest_trial_length = promising_node->depth();
		}

		statistics_.num_trials++;
		statistics_.num_expanded_nodes++;
	} while ((double) (clock() - begin) / CLOCKS_PER_SEC
		< Globals::config.time_per_move
		&& (root_->upper_bound() - root_->lower_bound()) > 1e-6);

	statistics_.num_tree_particles = model_->NumActiveParticles()
		- num_active_particles;
	statistics_.num_tree_nodes = root_->Size();
	statistics_.num_policy_nodes = root_->PolicyTreeSize();
	statistics_.num_particles_after_search = model_->NumActiveParticles();

	statistics_.final_lb = root_->lower_bound();
	statistics_.final_ub = root_->upper_bound();
	statistics_.time_search = (double) (clock() - begin) / CLOCKS_PER_SEC;

	logi << "[AEMS::Search]" << statistics_ << endl;

	ValuedAction astar = OptimalAction(root_);
	//delete root_;
	return astar;
}